

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O2

void Cec_ManSeqDeriveInfoInitRandom(Vec_Ptr_t *vInfo,Gia_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  char *__assertion;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar1 = Vec_PtrReadWordsSimInfo(vInfo);
  iVar6 = pAig->nRegs;
  if ((pCex == (Abc_Cex_t *)0x0) || (iVar6 == pCex->nRegs)) {
    if (iVar6 <= vInfo->nSize) {
      uVar4 = 0;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = uVar4;
      }
      while (uVar1 = (uint)uVar4, (int)uVar1 < iVar6) {
        pvVar2 = Vec_PtrEntry(vInfo,uVar1);
        for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
          if (pCex == (Abc_Cex_t *)0x0) {
            iVar6 = 0;
          }
          else {
            iVar6 = -(uint)(((uint)(&pCex[1].iPo)[uVar4 >> 5] >> (uVar1 & 0x1f) & 1) != 0);
          }
          *(int *)((long)pvVar2 + uVar3 * 4) = iVar6;
        }
        iVar6 = pAig->nRegs;
        uVar4 = (ulong)(uVar1 + 1);
      }
      while (iVar6 = (int)uVar4, iVar6 < vInfo->nSize) {
        pvVar2 = Vec_PtrEntry(vInfo,iVar6);
        for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          uVar1 = Gia_ManRandom(0);
          *(uint *)((long)pvVar2 + uVar4 * 4) = uVar1;
        }
        uVar4 = (ulong)(iVar6 + 1);
      }
      return;
    }
    __assertion = "Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo)";
    uVar1 = 0x6e;
  }
  else {
    __assertion = "pCex == NULL || Gia_ManRegNum(pAig) == pCex->nRegs";
    uVar1 = 0x6d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                ,uVar1,"void Cec_ManSeqDeriveInfoInitRandom(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)")
  ;
}

Assistant:

void Cec_ManSeqDeriveInfoInitRandom( Vec_Ptr_t * vInfo, Gia_Man_t * pAig, Abc_Cex_t * pCex )
{
    unsigned * pInfo;
    int k, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    assert( pCex == NULL || Gia_ManRegNum(pAig) == pCex->nRegs );
    assert( Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo) );
    for ( k = 0; k < Gia_ManRegNum(pAig); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = (pCex && Abc_InfoHasBit(pCex->pData, k))? ~0 : 0;
    }

    for ( ; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom( 0 );
    }
}